

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcut.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b63f::BinaryCut<long>::Run(BinaryCut<long> *this,istream *input_stream)

{
  bool bVar1;
  int iVar2;
  allocator_type *__a;
  int *in_RDI;
  int block_index_1;
  int block_index;
  vector<long,_std::allocator<long>_> data;
  bool local_6a;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  int *in_stack_ffffffffffffffc0;
  istream *in_stack_ffffffffffffffc8;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  int *actual_read_size;
  bool local_1;
  
  __a = (allocator_type *)(long)in_RDI[4];
  __n = &stack0xffffffffffffffcf;
  actual_read_size = in_RDI;
  std::allocator<long>::allocator((allocator<long> *)0x106fa0);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)__n,__a);
  std::allocator<long>::~allocator((allocator<long> *)0x106fc0);
  for (local_48 = 0; local_48 < in_RDI[2]; local_48 = local_48 + 1) {
    bVar1 = sptk::ReadStream<long>
                      ((bool)in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0,
                       in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
                       ,in_stack_ffffffffffffffc8,actual_read_size);
    if (!bVar1) {
      local_1 = false;
      goto LAB_0010713b;
    }
  }
  iVar2 = in_RDI[2];
  while( true ) {
    if ((in_RDI[3] == -1) || (local_6a = false, iVar2 <= in_RDI[3])) {
      local_6a = sptk::ReadStream<long>
                           ((bool)in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0,
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                            in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,actual_read_size);
    }
    if (local_6a == false) break;
    bVar1 = sptk::WriteStream<long>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0
                       ,(ostream *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (!bVar1) {
      local_1 = false;
LAB_0010713b:
      std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)__a);
      return local_1;
    }
    iVar2 = iVar2 + 1;
  }
  local_1 = true;
  goto LAB_0010713b;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    std::vector<T> data(block_length_);

    // Skip data.
    for (int block_index(0); block_index < start_number_; ++block_index) {
      if (!sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                            NULL)) {
        return false;
      }
    }

    // Write data.
    for (int block_index(start_number_);
         ((kMagicNumberForEndOfFile == end_number_ ||
           block_index <= end_number_) &&
          sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                           NULL));
         ++block_index) {
      if (!sptk::WriteStream(0, block_length_, data, &std::cout, NULL)) {
        return false;
      }
    }

    return true;
  }